

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bond.hpp
# Opt level: O2

string * __thiscall OpenMD::Bond::getName_abi_cxx11_(string *__return_storage_ptr__,Bond *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name_);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string getName() { return name_; }